

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reduce.cpp
# Opt level: O2

void transform_reduce_sum<tf::GuidedPartitioner<tf::DefaultClosureWrapper>>(uint W)

{
  int iVar1;
  code *pcVar2;
  double dVar3;
  char extraout_AL;
  long lVar4;
  Executor *this;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  int sum;
  int sol;
  ulong local_328;
  vector<Data,_std::allocator<Data>_> vec;
  Task stask;
  iterator end;
  iterator beg;
  shared_ptr<tf::WorkerInterface> local_2e8;
  Expression_lhs<const_int_&> local_2d8;
  ResultBuilder DOCTEST_RB;
  Result local_250;
  Taskflow taskflow;
  Executor executor;
  
  local_2e8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_2e8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)W,&local_2e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2e8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  tf::Taskflow::Taskflow(&taskflow);
  std::vector<Data,_std::allocator<Data>_>::vector(&vec,1000,(allocator_type *)&DOCTEST_RB);
  local_328 = 1;
  do {
    if ((ulong)((long)vec.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)vec.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) <= local_328) {
      std::_Vector_base<Data,_std::allocator<Data>_>::~_Vector_base
                (&vec.super__Vector_base<Data,_std::allocator<Data>_>);
      tf::Taskflow::~Taskflow(&taskflow);
      tf::Executor::~Executor(&executor);
      return;
    }
    for (lVar4 = 0; lVar4 != 0x14; lVar4 = lVar4 + 4) {
      iVar1 = *(int *)((long)&DAT_0015aca8 + lVar4);
      sum = 100;
      beg._M_current =
           vec.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      end._M_current =
           vec.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      sol = sum;
      std::
      vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ::clear(&taskflow._graph.
               super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             );
      DOCTEST_RB.super_AssertData._8_8_ = &vec;
      DOCTEST_RB.super_AssertData._24_8_ = &local_328;
      DOCTEST_RB.super_AssertData.m_expr = (char *)&sum;
      DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)&beg;
      DOCTEST_RB.super_AssertData.m_file = (char *)&end;
      tf::FlowBuilder::
      emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:971:37),_nullptr>
                ((FlowBuilder *)&stask,(anon_class_40_5_33a24316 *)&taskflow);
      tf::FlowBuilder::
      transform_reduce<std::reference_wrapper<__gnu_cxx::__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_>_>,_std::reference_wrapper<__gnu_cxx::__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:983:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:984:9),_tf::GuidedPartitioner<tf::DefaultClosureWrapper>,_nullptr>
                ((FlowBuilder *)&DOCTEST_RB.super_AssertData,&taskflow,(TestCaseData *)&beg,&end,
                 &sol,(long)iVar1);
      tf::Node::_precede(stask._node,(Node *)DOCTEST_RB.super_AssertData.m_test_case);
      this = &executor;
      tf::Executor::run((Future<void> *)&DOCTEST_RB.super_AssertData,this,&taskflow);
      std::__basic_future<void>::wait((__basic_future<void> *)&DOCTEST_RB.super_AssertData,this);
      tf::Future<void>::~Future((Future<void> *)&DOCTEST_RB.super_AssertData);
      DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
      DOCTEST_RB.super_AssertData._71_2_ = 0x17;
      DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_2d8.m_at = DT_REQUIRE;
      DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
      DOCTEST_RB.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_reduce.cpp"
      ;
      DOCTEST_RB.super_AssertData.m_line = 0x3e0;
      DOCTEST_RB.super_AssertData.m_expr = "sol == sum";
      DOCTEST_RB.super_AssertData.m_failed = true;
      DOCTEST_RB.super_AssertData.m_threw = false;
      DOCTEST_RB.super_AssertData.m_threw_as = false;
      DOCTEST_RB.super_AssertData.m_exception_type = "";
      DOCTEST_RB.super_AssertData.m_exception_string = "";
      local_2d8.lhs = &sol;
      doctest::detail::Expression_lhs<const_int_&>::operator==<int,_nullptr>
                (&local_250,&local_2d8,&sum);
      doctest::detail::ResultBuilder::setResult
                ((ResultBuilder *)&DOCTEST_RB.super_AssertData,&local_250);
      doctest::String::~String(&local_250.m_decomp);
      dVar3 = doctest::detail::ResultBuilder::log
                        ((ResultBuilder *)&DOCTEST_RB.super_AssertData,
                         (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      if (extraout_AL != '\0') {
        pcVar2 = (code *)swi(3);
        (*pcVar2)(SUB84(dVar3,0));
        return;
      }
      doctest::detail::ResultBuilder::react((ResultBuilder *)&DOCTEST_RB.super_AssertData);
      doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    }
    local_328 = local_328 + 1;
  } while( true );
}

Assistant:

void transform_reduce_sum(unsigned W) {

  tf::Executor executor(W);
  tf::Taskflow taskflow;

  std::vector<Data> vec(1000);

  for(size_t n=1; n<vec.size(); n++) {
    for(size_t c : {0, 1, 3, 7, 99}) {

      auto sum = 100;
      auto sol = 100;
      auto beg = vec.end();
      auto end = vec.end();

      taskflow.clear();
      auto stask = taskflow.emplace([&](){
        beg = vec.begin();
        end = vec.begin() + n;
        for(auto itr = beg; itr != end; itr++) {
          sum += itr->get();
        }
      });

      tf::Task ptask;

      ptask = taskflow.transform_reduce(
        std::ref(beg), std::ref(end), sol,
        [] (int l, int r)   { return  l + r; },
        [] (const Data& data) { return data.get(); },
        P(c)
      );

      stask.precede(ptask);

      executor.run(taskflow).wait();

      REQUIRE(sol == sum);
    }
  }
}